

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dmabuf.cpp
# Opt level: O0

MPP_RET mpp_dmabuf_sync_begin(RK_S32 fd,RK_S32 ro,char *caller)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  long lStack_28;
  RK_S32 ret;
  dma_buf_sync sync;
  char *caller_local;
  RK_S32 ro_local;
  RK_S32 fd_local;
  
  iVar1 = 3;
  if (ro != 0) {
    iVar1 = 1;
  }
  lStack_28 = (long)iVar1;
  sync.flags = (__u64)caller;
  iVar1 = ioctl(fd,0x40086200,&stack0xffffffffffffffd8);
  if (iVar1 == 0) {
    ro_local = 0;
  }
  else {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _mpp_log_l(2,(char *)0x0,"ioctl failed for %s from %s\n","mpp_dmabuf_sync_begin",pcVar3,
               sync.flags);
    ro_local = -1;
  }
  return ro_local;
}

Assistant:

MPP_RET mpp_dmabuf_sync_begin(RK_S32 fd, RK_S32 ro, const char *caller)
{
    struct dma_buf_sync sync;
    RK_S32 ret;

    sync.flags = DMA_BUF_SYNC_START | (ro ? DMA_BUF_SYNC_READ : DMA_BUF_SYNC_RW);

    ret = ioctl(fd, DMA_BUF_IOCTL_SYNC, &sync);
    if (ret) {
        mpp_err_f("ioctl failed for %s from %s\n", strerror(errno), caller);
        return MPP_NOK;
    }

    return MPP_OK;
}